

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O3

int mk_utils_hex2int(char *hex,int len)

{
  long lVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  
  cVar3 = *hex;
  iVar2 = 0;
  if (0 < len && cVar3 != '\0') {
    iVar2 = 0;
    lVar1 = 1;
    do {
      iVar4 = (int)cVar3;
      iVar2 = iVar2 * 0x10;
      if ((byte)(cVar3 + 0x9fU) < 6) {
        iVar2 = iVar2 + iVar4 + -0x57;
      }
      else if ((byte)(cVar3 + 0xbfU) < 6) {
        iVar2 = iVar2 + iVar4 + -0x37;
      }
      else {
        if (9 < (byte)(cVar3 - 0x30U)) {
          return -1;
        }
        iVar2 = iVar2 + iVar4 + -0x30;
      }
      cVar3 = hex[lVar1];
    } while ((cVar3 != '\0') && (iVar4 = (int)lVar1, lVar1 = lVar1 + 1, iVar4 < len));
  }
  iVar4 = -1;
  if (-1 < iVar2) {
    iVar4 = iVar2;
  }
  return iVar4;
}

Assistant:

int mk_utils_hex2int(char *hex, int len)
{
    int i = 0;
    int res = 0;
    char c;

    while ((c = *hex++) && i < len) {
        res *= 0x10;

        if (c >= 'a' && c <= 'f') {
            res += (c - 0x57);
        }
        else if (c >= 'A' && c <= 'F') {
            res += (c - 0x37);
        }
        else if (c >= '0' && c <= '9') {
            res += (c - 0x30);
        }
        else {
            return -1;
        }
        i++;
    }

    if (res < 0) {
        return -1;
    }

    return res;
}